

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

vector3 * vector3_multiplym4(vector3 *self,matrix4 *mT)

{
  anon_union_12_3_07544b15_for_vector3_0 local_20;
  
  local_20._0_8_ = 0;
  local_20.v[2] = 0.0;
  matrix4_multiplyv3(mT,self,(vector3 *)&local_20.field_1);
  *(undefined8 *)&self->field_0 = local_20._0_8_;
  (self->field_0).v[2] = local_20.v[2];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_multiplym4(struct vector3 *self, const struct matrix4 *mT)
{
	struct vector3 vR;

	vector3_zero(&vR);

	matrix4_multiplyv3(mT, self, &vR);

	vector3_set(self, &vR);

	return self;
}